

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcDar.c
# Opt level: O0

int Abc_NtkDarSec(Abc_Ntk_t *pNtk1,Abc_Ntk_t *pNtk2,Fra_Sec_t *pSecPar)

{
  int iVar1;
  Abc_Ntk_t *pMiter_00;
  int *piVar2;
  Aig_Man_t *p;
  int RetValue;
  Abc_Ntk_t *pMiter;
  Aig_Man_t *pMan;
  Fra_Sec_t *pSecPar_local;
  Abc_Ntk_t *pNtk2_local;
  Abc_Ntk_t *pNtk1_local;
  
  pMiter_00 = Abc_NtkMiter(pNtk1,pNtk2,0,0,0,0);
  if (pMiter_00 == (Abc_Ntk_t *)0x0) {
    Abc_Print(1,"Miter computation has failed.\n");
    pNtk1_local._4_4_ = 0;
  }
  else {
    iVar1 = Abc_NtkMiterIsConstant(pMiter_00);
    if (iVar1 == 0) {
      Abc_Print(1,"Networks are NOT EQUIVALENT after structural hashing.\n");
      piVar2 = Abc_NtkVerifyGetCleanModel(pMiter_00,pSecPar->nFramesMax);
      pMiter_00->pModel = piVar2;
      if (pMiter_00->pModel != (int *)0x0) {
        free(pMiter_00->pModel);
        pMiter_00->pModel = (int *)0x0;
      }
      Abc_NtkDelete(pMiter_00);
      pNtk1_local._4_4_ = 0;
    }
    else if (iVar1 == 1) {
      Abc_NtkDelete(pMiter_00);
      Abc_Print(1,"Networks are equivalent after structural hashing.\n");
      pNtk1_local._4_4_ = 1;
    }
    else {
      p = Abc_NtkToDar(pMiter_00,0,1);
      Abc_NtkDelete(pMiter_00);
      if (p == (Aig_Man_t *)0x0) {
        Abc_Print(1,"Converting miter into AIG has failed.\n");
        pNtk1_local._4_4_ = -1;
      }
      else {
        if (p->nRegs < 1) {
          __assert_fail("pMan->nRegs > 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abci/abcDar.c"
                        ,0xb88,"int Abc_NtkDarSec(Abc_Ntk_t *, Abc_Ntk_t *, Fra_Sec_t *)");
        }
        pNtk1_local._4_4_ = Fra_FraigSec(p,pSecPar,(Aig_Man_t **)0x0);
        Aig_ManStop(p);
      }
    }
  }
  return pNtk1_local._4_4_;
}

Assistant:

int Abc_NtkDarSec( Abc_Ntk_t * pNtk1, Abc_Ntk_t * pNtk2, Fra_Sec_t * pSecPar )
{
//    Fraig_Params_t Params;
    Aig_Man_t * pMan;
    Abc_Ntk_t * pMiter;//, * pTemp;
    int RetValue;
 
    // get the miter of the two networks
    pMiter = Abc_NtkMiter( pNtk1, pNtk2, 0, 0, 0, 0 );
    if ( pMiter == NULL )
    {
        Abc_Print( 1, "Miter computation has failed.\n" );
        return 0;
    }
    RetValue = Abc_NtkMiterIsConstant( pMiter );
    if ( RetValue == 0 )
    {
        extern void Abc_NtkVerifyReportErrorSeq( Abc_Ntk_t * pNtk1, Abc_Ntk_t * pNtk2, int * pModel, int nFrames );
        Abc_Print( 1, "Networks are NOT EQUIVALENT after structural hashing.\n" );
        // report the error
        pMiter->pModel = Abc_NtkVerifyGetCleanModel( pMiter, pSecPar->nFramesMax );
//        Abc_NtkVerifyReportErrorSeq( pNtk1, pNtk2, pMiter->pModel, pSecPar->nFramesMax );
        ABC_FREE( pMiter->pModel );
        Abc_NtkDelete( pMiter );
        return 0;
    }
    if ( RetValue == 1 )
    {
        Abc_NtkDelete( pMiter );
        Abc_Print( 1, "Networks are equivalent after structural hashing.\n" );
        return 1;
    }

    // commented out because sometimes the problem became non-inductive
/*
    // preprocess the miter by fraiging it
    // (note that for each functional class, fraiging leaves one representative;
    // so fraiging does not reduce the number of functions represented by nodes
    Fraig_ParamsSetDefault( &Params );
    Params.nBTLimit = 100000;
    pMiter = Abc_NtkFraig( pTemp = pMiter, &Params, 0, 0 );
    Abc_NtkDelete( pTemp );
    RetValue = Abc_NtkMiterIsConstant( pMiter );
    if ( RetValue == 0 )
    {
        extern void Abc_NtkVerifyReportErrorSeq( Abc_Ntk_t * pNtk1, Abc_Ntk_t * pNtk2, int * pModel, int nFrames );
        Abc_Print( 1, "Networks are NOT EQUIVALENT after structural hashing.\n" );
        // report the error
        pMiter->pModel = Abc_NtkVerifyGetCleanModel( pMiter, nFrames );
        Abc_NtkVerifyReportErrorSeq( pNtk1, pNtk2, pMiter->pModel, nFrames );
        ABC_FREE( pMiter->pModel );
        Abc_NtkDelete( pMiter );
        return 0;
    }
    if ( RetValue == 1 )
    {
        Abc_NtkDelete( pMiter );
        Abc_Print( 1, "Networks are equivalent after structural hashing.\n" );
        return 1;
    }
*/
    // derive the AIG manager
    pMan = Abc_NtkToDar( pMiter, 0, 1 );
    Abc_NtkDelete( pMiter );
    if ( pMan == NULL )
    {
        Abc_Print( 1, "Converting miter into AIG has failed.\n" );
        return -1;
    }
    assert( pMan->nRegs > 0 );

    // perform verification
    RetValue = Fra_FraigSec( pMan, pSecPar, NULL );
    Aig_ManStop( pMan );
    return RetValue;
}